

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::secondaryCommandBufferCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  VkCommandBuffer_s *pVVar1;
  VkCommandBuffer pVVar2;
  VkResult VVar3;
  int iVar4;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue pVVar5;
  Handle<(vk::HandleType)24> *pHVar6;
  VkCommandBuffer_s **ppVVar7;
  Handle<(vk::HandleType)10> *pHVar8;
  Handle<(vk::HandleType)6> *pHVar9;
  VkCommandPool *local_3e8;
  allocator<char> local_319;
  string local_318;
  undefined4 local_2f8;
  allocator<char> local_2f1;
  string local_2f0;
  deUint64 local_2d0;
  deUint64 local_2c8;
  undefined4 local_2c0 [2];
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkCommandBufferInheritanceInfo secCmdBufInheritInfo;
  RefData<vk::Handle<(vk::HandleType)10>_> local_248;
  undefined1 local_228 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkSubmitInfo submitInfo;
  VkCommandBuffer_s *local_1b8;
  VkCommandBuffer secondaryCmdBuffers [2];
  undefined1 local_198 [8];
  Move<vk::VkCommandBuffer_s_*> prtCmdBuffers [2];
  undefined1 local_150 [8];
  VkCommandBufferAllocateInfo cmdBufferInfo;
  undefined1 local_128 [8];
  Move<vk::VkCommandBuffer_s_*> primaryCmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)6>_> local_98;
  RefData<vk::Handle<(vk::HandleType)6>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  pVVar5 = Context::getUniversalQueue(context);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence(&local_98,vk_00,device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_78.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_78.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_98);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
             device_00,2,
             fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_e8,
             (Move *)&primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool)
  ;
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  cmdBufferInfo._24_8_ = pHVar6->m_internal;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_128,vk_00,device_00,
                    (VkCommandPool)cmdBufferInfo._24_8_);
  local_150._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufferInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferInfo._4_4_ = 0;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  cmdBufferInfo.pNext = (void *)pHVar6->m_internal;
  cmdBufferInfo.commandPool.m_internal._0_4_ = 1;
  cmdBufferInfo.commandPool.m_internal._4_4_ = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_198,vk_00,device_00,
             (VkCommandBufferAllocateInfo *)local_150);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)
             &prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
             device_00,(VkCommandBufferAllocateInfo *)local_150);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  local_1b8 = *ppVVar7;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_pool);
  secondaryCmdBuffers[0] = *ppVVar7;
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x4;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)
                    &secCmdBufInheritInfo.pipelineStatistics,vk_00,device_00,0,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_248,(Move *)&secCmdBufInheritInfo.pipelineStatistics);
  data_01.deleter.m_deviceIface = local_248.deleter.m_deviceIface;
  data_01.object.m_internal = local_248.object.m_internal;
  data_01.deleter.m_device._0_4_ = (int)local_248.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_248.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_248.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_228,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)10>_> *)&secCmdBufInheritInfo.pipelineStatistics);
  cmdBufferBeginInfo.pInheritanceInfo._0_4_ = 0x29;
  secCmdBufInheritInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  secCmdBufInheritInfo._4_4_ = 0;
  ::vk::Handle<(vk::HandleType)17>::Handle
            ((Handle<(vk::HandleType)17> *)&secCmdBufInheritInfo.pNext,0);
  secCmdBufInheritInfo.renderPass.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)23>::Handle
            ((Handle<(vk::HandleType)23> *)&secCmdBufInheritInfo.subpass,0);
  secCmdBufInheritInfo.framebuffer.m_internal._0_4_ = 0;
  secCmdBufInheritInfo.framebuffer.m_internal._4_4_ = 0;
  secCmdBufInheritInfo.occlusionQueryEnable = 0;
  local_2c0[0] = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 1;
  cmdBufferBeginInfo._16_8_ = &cmdBufferBeginInfo.pInheritanceInfo;
  VVar3 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,local_1b8,local_2c0);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(secondaryCmdBuffers[SET], &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x144);
  pVVar1 = local_1b8;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_228);
  local_2c8 = pHVar8->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])(vk_00,pVVar1,local_2c8,1);
  endCommandBuffer(vk_00,local_1b8);
  VVar3 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,secondaryCmdBuffers[0],local_2c0);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(secondaryCmdBuffers[WAIT], &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x148);
  pVVar2 = secondaryCmdBuffers[0];
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_228);
  (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,pVVar2,1,pHVar8,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk_00,secondaryCmdBuffers[0]);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  beginCommandBuffer(vk_00,*ppVVar7);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  (*vk_00->_vptr_DeviceInterface[0x77])(vk_00,*ppVVar7,2,&local_1b8);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  endCommandBuffer(vk_00,*ppVVar7);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
  local_2d0 = pHVar9->m_internal;
  VVar3 = (*vk_00->_vptr_DeviceInterface[2])
                    (vk_00,pVVar5,1,
                     &event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator,local_2d0);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x150);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
  iVar4 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,1,pHVar9,1,0xffffffffffffffff);
  if (iVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,
               "Wait and set even on device using secondary command buffers tests pass",&local_319);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"Queue should end execution",&local_2f1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  local_2f8 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_228);
  local_3e8 = &prtCmdBuffers[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  do {
    local_3e8 = local_3e8 + -4;
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
              ((Move<vk::VkCommandBuffer_s_*> *)local_3e8);
  } while (local_3e8 != (VkCommandPool *)local_198);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move((Move<vk::VkCommandBuffer_s_*> *)local_128)
  ;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus secondaryCommandBufferCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkDevice							device					= context.getDevice();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>					fence					(createFence(vk, device));
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>				primaryCmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));
	const VkCommandBufferAllocateInfo		cmdBufferInfo			=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,		// VkStructureType		sType;
																		DE_NULL,											// const void*			pNext;
																		*cmdPool,											// VkCommandPool		commandPool;
																		VK_COMMAND_BUFFER_LEVEL_SECONDARY,					// VkCommandBufferLevel	level;
																		1u,													// deUint32				commandBufferCount;
																	};
	const Move<VkCommandBuffer>				prtCmdBuffers[COUNT]	= {allocateCommandBuffer (vk, device, &cmdBufferInfo), allocateCommandBuffer (vk, device, &cmdBufferInfo)};
	VkCommandBuffer							secondaryCmdBuffers[]	= {*prtCmdBuffers[SET], *prtCmdBuffers[WAIT]};
	const VkSubmitInfo						submitInfo				=
																	{
																		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																		DE_NULL,						// const void*					pNext;
																		0u,								// deUint32						waitSemaphoreCount;
																		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																		1u,								// deUint32						commandBufferCount;
																		&primaryCmdBuffer.get(),		// const VkCommandBuffer*		pCommandBuffers;
																		0u,								// deUint32						signalSemaphoreCount;
																		DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
																	};
	const Unique<VkEvent>					event					(createEvent(vk, device));

	const VkCommandBufferInheritanceInfo	secCmdBufInheritInfo	=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,	//VkStructureType					sType;
																		DE_NULL,											//const void*						pNext;
																		DE_NULL,											//VkRenderPass					renderPass;
																		0u,													//deUint32						subpass;
																		DE_NULL,											//VkFramebuffer					framebuffer;
																		VK_FALSE,											//VkBool32						occlusionQueryEnable;
																		(VkQueryControlFlags)0u,							//VkQueryControlFlags				queryFlags;
																		(VkQueryPipelineStatisticFlags)0u,					//VkQueryPipelineStatisticFlags	pipelineStatistics;
																	};
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
																		DE_NULL,										// const void*                              pNext;
																		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags                flags;
																		&secCmdBufInheritInfo,							// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
																	};

	VK_CHECK(vk.beginCommandBuffer(secondaryCmdBuffers[SET], &cmdBufferBeginInfo));
	vk.cmdSetEvent(secondaryCmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, secondaryCmdBuffers[SET]);

	VK_CHECK(vk.beginCommandBuffer(secondaryCmdBuffers[WAIT], &cmdBufferBeginInfo));
	vk.cmdWaitEvents(secondaryCmdBuffers[WAIT], 1u, &event.get(),VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, secondaryCmdBuffers[WAIT]);

	beginCommandBuffer(vk, *primaryCmdBuffer);
	vk.cmdExecuteCommands(*primaryCmdBuffer, 2u, secondaryCmdBuffers);
	endCommandBuffer(vk, *primaryCmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device using secondary command buffers tests pass");
}